

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzbndmat.cpp
# Opt level: O1

int __thiscall TPZFBMatrix<int>::SetBand(TPZFBMatrix<int> *this,int64_t newBand)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  iVar1 = (*(this->super_TPZMatrix<int>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xc])
                    ();
  if (CONCAT44(extraout_var,iVar1) <= newBand) {
    TPZMatrix<int>::Error
              ("int TPZFBMatrix<int>::SetBand(int64_t) [TVar = int]",
               "SetBand <the band must be lower than the matrix dimension ");
  }
  iVar1 = (*(this->super_TPZMatrix<int>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xc])
                    (this);
  this->fBandLower = newBand;
  this->fBandUpper = newBand;
  (*(this->fElem)._vptr_TPZVec[3])(&this->fElem,(newBand * 3 + 1) * CONCAT44(extraout_var_00,iVar1))
  ;
  (*(this->super_TPZMatrix<int>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xf])(this);
  return 1;
}

Assistant:

int
TPZFBMatrix<TVar>::SetBand( int64_t newBand )
{
	if ( newBand >= Dim() )
		this->Error(__PRETTY_FUNCTION__, "SetBand <the band must be lower than the matrix dimension " );
	
	uint64_t newSize = Dim()*(3 * newBand + 1);
    fBandLower = newBand;
    fBandUpper = newBand;
    fElem.resize(newSize);
    Zero();
	return( 1 );
}